

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O1

void ecx_pusherror(ecx_contextt *context,ec_errort *Ec)

{
  ec_eringt *peVar1;
  ec_timet eVar2;
  ec_timet eVar3;
  anon_union_8_2_f8b78f4e_for_ec_errort_6 aVar4;
  ec_errort *peVar5;
  uint8 uVar6;
  undefined1 uVar7;
  ec_err_type eVar8;
  short sVar9;
  short sVar10;
  
  peVar1 = context->elist;
  sVar10 = peVar1->head;
  eVar2 = Ec->Time;
  eVar3 = *(ec_timet *)&Ec->Signal;
  uVar6 = Ec->SubIdx;
  uVar7 = Ec->field_0xf;
  eVar8 = Ec->Etype;
  aVar4 = Ec->field_6;
  peVar5 = peVar1->Error + sVar10;
  peVar5->Index = Ec->Index;
  peVar5->SubIdx = uVar6;
  peVar5->field_0xf = uVar7;
  peVar5->Etype = eVar8;
  *(anon_union_8_2_f8b78f4e_for_ec_errort_6 *)(&peVar5->Index + 4) = aVar4;
  peVar1->Error[sVar10].Time = eVar2;
  (&peVar1->Error[sVar10].Time)[1] = eVar3;
  peVar1 = context->elist;
  sVar9 = peVar1->head + 1;
  sVar10 = 0;
  if (sVar9 < 0x41) {
    sVar10 = sVar9;
  }
  peVar1->Error[peVar1->head].Signal = '\x01';
  peVar1->head = sVar10;
  if (sVar10 == peVar1->tail) {
    peVar1->tail = peVar1->tail + 1;
  }
  if (0x40 < peVar1->tail) {
    peVar1->tail = 0;
  }
  *context->ecaterror = '\x01';
  return;
}

Assistant:

void ecx_pusherror(ecx_contextt *context, const ec_errort *Ec)
{
   context->elist->Error[context->elist->head] = *Ec;
   context->elist->Error[context->elist->head].Signal = TRUE;
   context->elist->head++;
   if (context->elist->head > EC_MAXELIST)
   {
      context->elist->head = 0;
   }
   if (context->elist->head == context->elist->tail)
   {
      context->elist->tail++;
   }
   if (context->elist->tail > EC_MAXELIST)
   {
      context->elist->tail = 0;
   }
   *(context->ecaterror) = TRUE;
}